

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lapi.c
# Opt level: O1

void lua_createtable(lua_State *L,int narray,int nrec)

{
  StkId pTVar1;
  Table *x_;
  Table *t;
  
  t = luaH_new(L);
  pTVar1 = L->top;
  (pTVar1->value_).gc = (GCObject *)t;
  pTVar1->tt_ = 0x45;
  L->top = L->top + 1;
  if (0 < narray || 0 < nrec) {
    luaH_resize(L,t,narray,nrec);
  }
  if (0 < L->l_G->GCdebt) {
    luaC_step(L);
    return;
  }
  return;
}

Assistant:

LUA_API void lua_createtable(lua_State *L, int narray, int nrec) {
    Table *t;
    lua_lock(L);
    t = luaH_new(L);
    sethvalue(L, L->top, t);
    api_incr_top(L);
    if (narray > 0 || nrec > 0)
        luaH_resize(L, t, narray, nrec);
    luaC_checkGC(L);
    lua_unlock(L);
}